

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeTexureSampleCase::iterate
          (NegativeTexureSampleCase *this)

{
  ostringstream *this_00;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  char *description;
  GLsizei samples;
  GLenum GVar3;
  CallLogWrapper gl;
  Texture texture;
  int maxSamples;
  CallLogWrapper local_1f8;
  ObjectWrapper local_1e0;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  GVar3 = (this->m_sampleParam == SAMPLECOUNT_HIGH) + 0x501;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_1f8,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(&local_1e0,(Functions *)CONCAT44(extraout_var_00,iVar1),traits);
  local_1f8.m_enableLog = true;
  if (this->m_sampleParam == SAMPLECOUNT_ZERO) {
    samples = 0;
  }
  else {
    samples = -1;
    if (this->m_sampleParam == SAMPLECOUNT_HIGH) {
      local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
      glu::CallLogWrapper::glGetInternalformativ
                (&local_1f8,0x9100,0x8058,0x80a9,1,(GLint *)local_1a8);
      GVar2 = glu::CallLogWrapper::glGetError(&local_1f8);
      glu::checkError(GVar2,"glGetInternalformativ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x7e2);
      samples = local_1a8._0_4_ + 1;
    }
  }
  glu::CallLogWrapper::glBindTexture(&local_1f8,0x9100,local_1e0.m_object);
  glu::CallLogWrapper::glTexStorage2DMultisample(&local_1f8,0x9100,samples,0x8058,0x40,0x40,'\0');
  GVar2 = glu::CallLogWrapper::glGetError(&local_1f8);
  if (GVar2 != GVar3) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Got unexpected error: ",0x16);
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", expected: ",0xc);
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = GVar3;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
    description = "Got wrong error code";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(GVar2 != GVar3),
             description);
  glu::ObjectWrapper::~ObjectWrapper(&local_1e0);
  glu::CallLogWrapper::~CallLogWrapper(&local_1f8);
  return STOP;
}

Assistant:

NegativeTexureSampleCase::IterateResult NegativeTexureSampleCase::iterate (void)
{
	const glw::GLenum		expectedError	= (m_sampleParam == SAMPLECOUNT_HIGH) ? (GL_INVALID_OPERATION) : (GL_INVALID_VALUE);
	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::Texture			texture			(m_context.getRenderContext());
	glw::GLenum				error;
	int						samples			= -1;

	gl.enableLogging(true);

	// calc samples

	if (m_sampleParam == SAMPLECOUNT_HIGH)
	{
		int maxSamples = 0;

		gl.glGetInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, GL_RGBA8, GL_SAMPLES, 1, &maxSamples);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetInternalformativ");

		samples = maxSamples + 1;
	}
	else if (m_sampleParam == SAMPLECOUNT_ZERO)
		samples = 0;
	else
		DE_ASSERT(DE_FALSE);

	// create texture with bad values

	gl.glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, *texture);
	gl.glTexStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, samples, GL_RGBA8, 64, 64, GL_FALSE);
	error = gl.glGetError();

	// expect failure

	if (error == expectedError)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Got unexpected error: " << glu::getErrorStr(error) << ", expected: " << glu::getErrorStr(expectedError) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong error code");
	}

	return STOP;
}